

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

void __thiscall
GlobOptBlockData::CloneBlockData
          (GlobOptBlockData *this,BasicBlock *toBlockContext,BasicBlock *fromBlock)

{
  GlobOpt *pGVar1;
  JitArenaAllocator *alloc;
  CapturedValues *this_00;
  bool *pbVar2;
  code *pcVar3;
  uint uVar4;
  bool bVar5;
  ValueHashTable<Sym_*,_Value_*> *pVVar6;
  ValueHashTable<ExprHash,_Value_*> *pVVar7;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  undefined4 *puVar9;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *to;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar10;
  
  pGVar1 = (fromBlock->globOptData).globOpt;
  this->globOpt = pGVar1;
  alloc = pGVar1->alloc;
  pVVar6 = ValueHashTable<Sym_*,_Value_*>::Copy((fromBlock->globOptData).symToValueMap);
  this->symToValueMap = pVVar6;
  pVVar7 = ValueHashTable<ExprHash,_Value_*>::Copy((fromBlock->globOptData).exprToValueMap);
  this->exprToValueMap = pVVar7;
  GlobOpt::CloneValues(this->globOpt,toBlockContext,this,&fromBlock->globOptData);
  bVar5 = GlobOpt::DoBoundCheckHoist(this->globOpt);
  if (bVar5) {
    GlobOpt::CloneBoundCheckHoistBlockData
              (this->globOpt,toBlockContext,this,fromBlock,&fromBlock->globOptData);
  }
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3d6ef4);
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = alloc;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->liveFields = pBVar8;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (pBVar8,(fromBlock->globOptData).liveFields);
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3d6ef4);
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = alloc;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->liveArrayValues = pBVar8;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (pBVar8,(fromBlock->globOptData).liveArrayValues);
  if ((fromBlock->globOptData).maybeWrittenTypeSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,alloc,0x3d6ef4);
    pBVar8->head = (Type_conflict)0x0;
    pBVar8->lastFoundIndex = (Type_conflict)0x0;
    pBVar8->alloc = alloc;
    pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
    this->maybeWrittenTypeSyms = pBVar8;
    BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
              (pBVar8,(fromBlock->globOptData).maybeWrittenTypeSyms);
  }
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3d6ef4);
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = alloc;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->isTempSrc = pBVar8;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (pBVar8,(fromBlock->globOptData).isTempSrc);
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3d6ef4);
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = alloc;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->liveVarSyms = pBVar8;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (pBVar8,(fromBlock->globOptData).liveVarSyms);
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3d6ef4);
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = alloc;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->liveInt32Syms = pBVar8;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (pBVar8,(fromBlock->globOptData).liveInt32Syms);
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3d6ef4);
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = alloc;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->liveLossyInt32Syms = pBVar8;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (pBVar8,(fromBlock->globOptData).liveLossyInt32Syms);
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3d6ef4);
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = alloc;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->liveFloat64Syms = pBVar8;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (pBVar8,(fromBlock->globOptData).liveFloat64Syms);
  bVar5 = GlobOpt::TrackArgumentsObject(this->globOpt);
  if ((bVar5) &&
     (pBVar8 = (fromBlock->globOptData).argObjSyms,
     pBVar8 != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    pBVar8 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pBVar8,alloc);
    this->argObjSyms = pBVar8;
  }
  pBVar8 = (fromBlock->globOptData).maybeTempObjectSyms;
  if (pBVar8 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_00461ace:
    pBVar8 = (fromBlock->globOptData).canStoreTempObjectSyms;
    if (pBVar8 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      bVar5 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar8);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                           ,0x129,
                           "(fromData->canStoreTempObjectSyms == nullptr || fromData->canStoreTempObjectSyms->IsEmpty())"
                           ,
                           "fromData->canStoreTempObjectSyms == nullptr || fromData->canStoreTempObjectSyms->IsEmpty()"
                          );
        if (!bVar5) goto LAB_00461d14;
        *puVar9 = 0;
      }
    }
  }
  else {
    bVar5 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar8);
    if (bVar5) goto LAB_00461ace;
    pBVar8 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                       ((fromBlock->globOptData).maybeTempObjectSyms,alloc);
    this->maybeTempObjectSyms = pBVar8;
    pBVar8 = (fromBlock->globOptData).canStoreTempObjectSyms;
    if (pBVar8 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      bVar5 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar8);
      if (!bVar5) {
        pBVar8 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                           ((fromBlock->globOptData).canStoreTempObjectSyms,alloc);
        this->canStoreTempObjectSyms = pBVar8;
      }
    }
  }
  this->curFunc = (fromBlock->globOptData).curFunc;
  if ((fromBlock->globOptData).callSequence ==
      (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    this->callSequence = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  }
  else {
    to = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
         new<Memory::JitArenaAllocator>(0x10,alloc,0x3d6ef4);
    (to->super_SListNodeBase<Memory::ArenaAllocator>).next = (Type)to;
    (to->super_RealCount).count = 0;
    this->callSequence = to;
    SListBase<IR::Opnd*,Memory::ArenaAllocator,RealCount>::
    CopyTo<&SListBase<IR::Opnd*,Memory::ArenaAllocator,RealCount>::DefaultCopyElement>
              ((SListBase<IR::Opnd*,Memory::ArenaAllocator,RealCount> *)
               (fromBlock->globOptData).callSequence,&alloc->super_ArenaAllocator,to);
  }
  uVar4 = (fromBlock->globOptData).argOutCount;
  this->startCallCount = (fromBlock->globOptData).startCallCount;
  this->argOutCount = uVar4;
  this->totalOutParamCount = (fromBlock->globOptData).totalOutParamCount;
  this->inlinedArgOutSize = (fromBlock->globOptData).inlinedArgOutSize;
  this->hasCSECandidates = (fromBlock->globOptData).hasCSECandidates;
  pBVar10 = (fromBlock->globOptData).stackLiteralInitFldDataMap;
  if ((pBVar10 ==
       (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)0x0) ||
     ((this->globOpt->prePassLoop != (Loop *)0x0 &&
      (((toBlockContext->field_0x18 & 4) == 0 ||
       (toBlockContext->loop != this->globOpt->rootLoopPrePass)))))) {
    pBVar10 = (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)0x0;
  }
  else {
    pBVar10 = JsUtil::
              BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Clone(pBVar10);
  }
  this->stackLiteralInitFldDataMap = pBVar10;
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3d6ef4);
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = alloc;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  this->changedSyms = pBVar8;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (pBVar8,(fromBlock->globOptData).changedSyms);
  this_00 = (fromBlock->globOptData).capturedValues;
  this->capturedValues = this_00;
  if (this_00 != (CapturedValues *)0x0) {
    CapturedValues::IncrementRefCount(this_00);
  }
  pbVar2 = (fromBlock->globOptData).hasDataRef;
  if (pbVar2 != (bool *)0x0) {
    if (*pbVar2 != false) goto LAB_00461cfb;
    (fromBlock->globOptData).hasDataRef = (bool *)0x0;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar9 = 1;
  bVar5 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                     ,0x151,"(fromData->HasData())","fromData->HasData()");
  if (!bVar5) {
LAB_00461d14:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar9 = 0;
LAB_00461cfb:
  OnDataInitialized(this,alloc);
  return;
}

Assistant:

void GlobOptBlockData::CloneBlockData(BasicBlock *const toBlockContext, BasicBlock *const fromBlock)
{
    GlobOptBlockData *const fromData = &fromBlock->globOptData;

    this->globOpt = fromData->globOpt;

    JitArenaAllocator *const alloc = this->globOpt->alloc;

    this->symToValueMap = fromData->symToValueMap->Copy();
    this->exprToValueMap = fromData->exprToValueMap->Copy();

    // Clone the values as well to allow for flow-sensitive ValueInfo
    this->globOpt->CloneValues(toBlockContext, this, fromData);

    if(this->globOpt->DoBoundCheckHoist())
    {
        this->globOpt->CloneBoundCheckHoistBlockData(toBlockContext, this, fromBlock, fromData);
    }

    this->liveFields = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveFields->Copy(fromData->liveFields);

    this->liveArrayValues = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveArrayValues->Copy(fromData->liveArrayValues);

    if (fromData->maybeWrittenTypeSyms)
    {
        this->maybeWrittenTypeSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
        this->maybeWrittenTypeSyms->Copy(fromData->maybeWrittenTypeSyms);
    }

    this->isTempSrc = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->isTempSrc->Copy(fromData->isTempSrc);

    this->liveVarSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveVarSyms->Copy(fromData->liveVarSyms);

    this->liveInt32Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveInt32Syms->Copy(fromData->liveInt32Syms);

    this->liveLossyInt32Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveLossyInt32Syms->Copy(fromData->liveLossyInt32Syms);

    this->liveFloat64Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveFloat64Syms->Copy(fromData->liveFloat64Syms);

    if (this->globOpt->TrackArgumentsObject() && fromData->argObjSyms)
    {
        this->argObjSyms = fromData->argObjSyms->CopyNew(alloc);
    }
    if (fromData->maybeTempObjectSyms && !fromData->maybeTempObjectSyms->IsEmpty())
    {
        this->maybeTempObjectSyms = fromData->maybeTempObjectSyms->CopyNew(alloc);
        if (fromData->canStoreTempObjectSyms && !fromData->canStoreTempObjectSyms->IsEmpty())
        {
            this->canStoreTempObjectSyms = fromData->canStoreTempObjectSyms->CopyNew(alloc);
        }
    }
    else
    {
        Assert(fromData->canStoreTempObjectSyms == nullptr || fromData->canStoreTempObjectSyms->IsEmpty());
    }

    this->curFunc = fromData->curFunc;
    if (fromData->callSequence != nullptr)
    {
        this->callSequence = JitAnew(alloc, SListBase<IR::Opnd *>);
        fromData->callSequence->CopyTo(alloc, *(this->callSequence));
    }
    else
    {
        this->callSequence = nullptr;
    }

    this->startCallCount = fromData->startCallCount;
    this->argOutCount = fromData->argOutCount;
    this->totalOutParamCount = fromData->totalOutParamCount;
    this->inlinedArgOutSize = fromData->inlinedArgOutSize;
    this->hasCSECandidates = fromData->hasCSECandidates;

    // Although we don't need the data on loop pre pass, we need to do it for the loop header
    // because we capture the loop header bailout on loop prepass
    if (fromData->stackLiteralInitFldDataMap != nullptr &&
        (!this->globOpt->IsLoopPrePass() || (toBlockContext->isLoopHeader && toBlockContext->loop == this->globOpt->rootLoopPrePass)))
    {
        this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap->Clone();
    }
    else
    {
        this->stackLiteralInitFldDataMap = nullptr;
    }

    this->changedSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->changedSyms->Copy(fromData->changedSyms);
    this->capturedValues = fromData->capturedValues;
    if (this->capturedValues)
    {
        this->capturedValues->IncrementRefCount();
    }

    Assert(fromData->HasData());
    this->OnDataInitialized(alloc);
}